

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map_checked.hh
# Opt level: O2

uint64_t __thiscall doublechecked::Roaring64Map::maximum(Roaring64Map *this)

{
  uint64_t uVar1;
  long lVar2;
  uint64_t uVar3;
  
  uVar1 = roaring::Roaring64Map::maximum(&this->plain);
  if ((this->check)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    uVar3 = 0;
  }
  else {
    lVar2 = std::_Rb_tree_decrement(&(this->check)._M_t._M_impl.super__Rb_tree_header._M_header);
    uVar3 = *(uint64_t *)(lVar2 + 0x20);
  }
  _assert_true((ulong)(uVar1 == uVar3),"check.empty() ? ans == 0 : ans == *check.rbegin()",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64map_checked.hh"
               ,0xd1);
  return uVar1;
}

Assistant:

uint64_t maximum() const {
        uint64_t ans = plain.maximum();
        assert_true(check.empty() ? ans == 0 : ans == *check.rbegin());
        return ans;
    }